

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O0

void sshproxy_send_close(SshProxy *sp)

{
  int iVar1;
  SshProxy *sp_local;
  
  if (sp->clientseat != (Seat *)0x0) {
    interactor_return_seat(sp->clientitr);
  }
  if ((sp->conn_established & 1U) == 0) {
    plug_log(sp->plug,1,sp->addr,sp->port,sp->errmsg,0);
  }
  if (sp->errmsg == (char *)0x0) {
    if (((sp->conn_established & 1U) == 0) && (iVar1 = backend_exitcode(sp->backend), iVar1 == 0)) {
      plug_closing_user_abort(sp->plug);
    }
    else {
      plug_closing_normal(sp->plug);
    }
  }
  else {
    plug_closing_error(sp->plug,sp->errmsg);
  }
  return;
}

Assistant:

static void sshproxy_send_close(SshProxy *sp)
{
    if (sp->clientseat)
        interactor_return_seat(sp->clientitr);

    if (!sp->conn_established)
        plug_log(sp->plug, PLUGLOG_CONNECT_FAILED, sp->addr, sp->port,
                 sp->errmsg, 0);

    if (sp->errmsg)
        plug_closing_error(sp->plug, sp->errmsg);
    else if (!sp->conn_established && backend_exitcode(sp->backend) == 0)
        plug_closing_user_abort(sp->plug);
    else
        plug_closing_normal(sp->plug);
}